

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdefaultrt.hpp
# Opt level: O3

int __thiscall
soplex::
SPxDefaultRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectLeave(SPxDefaultRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *val,
             number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *param_2,bool param_3)

{
  uint *puVar1;
  undefined8 *puVar2;
  bool bVar3;
  fpclass_type fVar4;
  int32_t iVar5;
  long lVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  int iVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  ulong uVar12;
  cpp_dec_float<50U,_int,_void> *pcVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long in_FS_OFFSET;
  Real a;
  type t;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  cpp_dec_float<50U,_int,_void> local_1b8;
  uint local_17c;
  long local_178;
  cpp_dec_float<50U,_int,_void> *local_170;
  undefined1 local_168 [16];
  uint local_158 [3];
  undefined3 uStack_14b;
  uint local_148 [3];
  bool local_13c;
  undefined8 local_138;
  undefined1 local_128 [16];
  uint local_118 [3];
  undefined3 uStack_10b;
  uint local_108;
  undefined3 uStack_103;
  int local_100;
  bool local_fc;
  undefined8 local_f8;
  long local_f0;
  undefined1 local_e8 [16];
  uint local_d8 [3];
  undefined3 uStack_cb;
  uint local_c8 [3];
  bool local_bc;
  undefined8 local_b8;
  cpp_dec_float<50U,_int,_void> *local_a8;
  long local_a0;
  cpp_dec_float<50U,_int,_void> local_98;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  iVar11 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])();
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)(*(long *)(CONCAT44(extraout_var,iVar11) + 0xa48) + 0x50));
  iVar11 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  local_178 = **(long **)(CONCAT44(extraout_var_00,iVar11) + 0xa48);
  iVar11 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  lVar6 = *(long *)(*(long *)(CONCAT44(extraout_var_01,iVar11) + 0xa48) + 0x70);
  iVar11 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  lVar16 = *(long *)(CONCAT44(extraout_var_02,iVar11) + 0xa48);
  iVar11 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  local_f0 = *(long *)(CONCAT44(extraout_var_03,iVar11) + 0xa10);
  iVar11 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  local_a0 = *(long *)(CONCAT44(extraout_var_04,iVar11) + 0xa28);
  local_a8 = (cpp_dec_float<50U,_int,_void> *)this;
  iVar11 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  a = Tolerances::epsilon(*(Tolerances **)(CONCAT44(extraout_var_05,iVar11) + 0x1e0));
  local_98.fpclass = cpp_dec_float_finite;
  local_98.prec_elem = 10;
  local_98.data._M_elems[0] = 0;
  local_98.data._M_elems[1] = 0;
  local_98.data._M_elems[2] = 0;
  local_98.data._M_elems[3] = 0;
  local_98.data._M_elems[4] = 0;
  local_98.data._M_elems[5] = 0;
  local_98.data._M_elems._24_5_ = 0;
  local_98.data._M_elems[7]._1_3_ = 0;
  local_98.data._M_elems[8] = 0;
  local_98.data._M_elems[9] = 0;
  local_98.exp = 0;
  local_98.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_98,a);
  local_b8._0_4_ = cpp_dec_float_finite;
  local_b8._4_4_ = 10;
  local_e8 = (undefined1  [16])0x0;
  local_d8[0] = 0;
  local_d8[1] = 0;
  stack0xffffffffffffff30 = 0;
  uStack_cb = 0;
  local_c8[0] = 0;
  local_c8[1] = 0;
  local_c8[2] = 0;
  local_bc = false;
  local_170 = &val->m_backend;
  if ((val->m_backend).fpclass != cpp_dec_float_NaN) {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&local_1b8,0,(type *)0x0);
    iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&val->m_backend,&local_1b8);
    if (0 < iVar11) {
      if (*(int *)(lVar16 + 0x58) < 1) {
        return -1;
      }
      local_48 = *(double *)(in_FS_OFFSET + -8);
      local_a8 = &(((SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)&local_a8->data)->delta).m_backend;
      uStack_40 = 0;
      local_58 = -local_48;
      uStack_50 = 0x8000000000000000;
      local_17c = 0xffffffff;
      lVar17 = 0;
      do {
        uVar14 = *(uint *)(*(long *)(lVar16 + 0x60) + lVar17 * 4);
        lVar15 = (long)(int)uVar14 * 0x38;
        local_c8._0_8_ = *(undefined8 *)(lVar6 + 0x20 + lVar15);
        local_e8 = *(undefined1 (*) [16])(lVar6 + lVar15);
        puVar1 = (uint *)(lVar6 + 0x10 + lVar15);
        local_d8._0_8_ = *(undefined8 *)puVar1;
        uVar7 = *(undefined8 *)(puVar1 + 2);
        stack0xffffffffffffff30 = (undefined5)uVar7;
        uStack_cb = (undefined3)((ulong)uVar7 >> 0x28);
        local_c8[2] = *(int *)(lVar6 + 0x28 + lVar15);
        local_bc = *(bool *)(lVar6 + 0x2c + lVar15);
        local_b8 = *(undefined8 *)(lVar6 + 0x30 + lVar15);
        if (local_98.fpclass == cpp_dec_float_NaN || (fpclass_type)local_b8 == cpp_dec_float_NaN) {
LAB_002a41fa:
          local_1b8.data._M_elems[0] = local_98.data._M_elems[0];
          local_1b8.data._M_elems[1] = local_98.data._M_elems[1];
          local_1b8.data._M_elems[2] = local_98.data._M_elems[2];
          local_1b8.data._M_elems[3] = local_98.data._M_elems[3];
          auVar10 = (undefined1  [16])local_1b8.data._M_elems._0_16_;
          local_1b8.data._M_elems._32_5_ = local_98.data._M_elems._32_5_;
          local_1b8.data._M_elems[9]._1_3_ = local_98.data._M_elems[9]._1_3_;
          local_1b8.data._M_elems[4] = local_98.data._M_elems[4];
          local_1b8.data._M_elems[5] = local_98.data._M_elems[5];
          local_1b8.data._M_elems._24_5_ = local_98.data._M_elems._24_5_;
          local_1b8.data._M_elems[7]._1_3_ = local_98.data._M_elems[7]._1_3_;
          local_1b8.exp = local_98.exp;
          local_1b8.neg = local_98.neg;
          local_1b8.prec_elem = local_98.prec_elem;
          local_1b8.fpclass = local_98.fpclass;
          local_1b8.data._M_elems[0] = local_98.data._M_elems[0];
          if (local_1b8.data._M_elems[0] != 0 || local_98.fpclass != cpp_dec_float_finite) {
            local_1b8.neg = (bool)(local_98.neg ^ 1);
          }
          local_1b8.data._M_elems._0_16_ = auVar10;
          if (((local_98.fpclass != cpp_dec_float_NaN) &&
              ((fpclass_type)local_b8 != cpp_dec_float_NaN)) &&
             (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)local_e8,&local_1b8), iVar11 < 0)
             ) {
            ::soplex::infinity::__tls_init();
            pcVar13 = (cpp_dec_float<50U,_int,_void> *)(local_a0 + lVar15);
            local_1b8.fpclass = cpp_dec_float_finite;
            local_1b8.prec_elem = 10;
            local_1b8.data._M_elems[0] = 0;
            local_1b8.data._M_elems[1] = 0;
            local_1b8.data._M_elems[2] = 0;
            local_1b8.data._M_elems[3] = 0;
            local_1b8.data._M_elems[4] = 0;
            local_1b8.data._M_elems[5] = 0;
            local_1b8.data._M_elems._24_5_ = 0;
            local_1b8.data._M_elems[7]._1_3_ = 0;
            local_1b8.data._M_elems._32_5_ = 0;
            local_1b8.data._M_elems[9]._1_3_ = 0;
            local_1b8.exp = 0;
            local_1b8.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_1b8,local_58);
            if (((pcVar13->fpclass != cpp_dec_float_NaN) && (local_1b8.fpclass != cpp_dec_float_NaN)
                ) && (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                               compare(pcVar13,&local_1b8), 0 < iVar11)) {
              local_138._0_4_ = cpp_dec_float_finite;
              local_138._4_4_ = 10;
              local_168 = (undefined1  [16])0x0;
              local_158[0] = 0;
              local_158[1] = 0;
              stack0xfffffffffffffeb0 = 0;
              uStack_14b = 0;
              local_148[0] = 0;
              local_148[1] = 0;
              local_148[2] = 0;
              local_13c = false;
              if ((cpp_dec_float<50U,_int,_void> *)local_168 ==
                  (cpp_dec_float<50U,_int,_void> *)(lVar15 + local_178)) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          ((cpp_dec_float<50U,_int,_void> *)local_168,pcVar13);
                if (local_168._0_4_ != 0 || (fpclass_type)local_138 != cpp_dec_float_finite) {
                  local_13c = (bool)(local_13c ^ 1);
                }
              }
              else {
                if ((cpp_dec_float<50U,_int,_void> *)local_168 != pcVar13) {
                  local_148._0_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 8);
                  local_168 = *(undefined1 (*) [16])(pcVar13->data)._M_elems;
                  local_158._0_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 4);
                  uVar7 = *(undefined8 *)((pcVar13->data)._M_elems + 6);
                  stack0xfffffffffffffeb0 = (undefined5)uVar7;
                  uStack_14b = (undefined3)((ulong)uVar7 >> 0x28);
                  local_148[2] = pcVar13->exp;
                  local_13c = pcVar13->neg;
                  local_138._0_4_ = pcVar13->fpclass;
                  local_138._4_4_ = pcVar13->prec_elem;
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          ((cpp_dec_float<50U,_int,_void> *)local_168,
                           (cpp_dec_float<50U,_int,_void> *)(lVar15 + local_178));
              }
              local_f8._0_4_ = cpp_dec_float_finite;
              local_f8._4_4_ = 10;
              local_128 = (undefined1  [16])0x0;
              local_118[0] = 0;
              local_118[1] = 0;
              stack0xfffffffffffffef0 = 0;
              uStack_10b = 0;
              _local_108 = 0;
              uStack_103 = 0;
              local_100 = 0;
              local_fc = false;
              if ((cpp_dec_float<50U,_int,_void> *)local_128 == local_a8) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          ((cpp_dec_float<50U,_int,_void> *)local_128,
                           (cpp_dec_float<50U,_int,_void> *)local_168);
                if (local_128._0_4_ != 0 || (fpclass_type)local_f8 != cpp_dec_float_finite) {
                  local_fc = (bool)(local_fc ^ 1);
                }
              }
              else {
                _local_108 = (undefined5)local_148._0_8_;
                uStack_103 = SUB83(local_148._0_8_,5);
                local_118[0] = local_158[0];
                local_118[1] = local_158[1];
                stack0xfffffffffffffef0 = stack0xfffffffffffffeb0;
                uStack_10b = uStack_14b;
                local_128 = local_168;
                local_100 = local_148[2];
                local_fc = local_13c;
                local_f8._0_4_ = (fpclass_type)local_138;
                local_f8._4_4_ = local_138._4_4_;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          ((cpp_dec_float<50U,_int,_void> *)local_128,local_a8);
              }
              goto LAB_002a4566;
            }
          }
        }
        else {
          iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             ((cpp_dec_float<50U,_int,_void> *)local_e8,&local_98);
          if (iVar11 < 1) {
            goto LAB_002a41fa;
          }
          ::soplex::infinity::__tls_init();
          pcVar13 = (cpp_dec_float<50U,_int,_void> *)(local_f0 + lVar15);
          local_1b8.fpclass = cpp_dec_float_finite;
          local_1b8.prec_elem = 10;
          local_1b8.data._M_elems._0_16_ = ZEXT816(0);
          local_1b8.data._M_elems[4] = 0;
          local_1b8.data._M_elems[5] = 0;
          local_1b8.data._M_elems._24_5_ = 0;
          local_1b8.data._M_elems[7]._1_3_ = 0;
          local_1b8.data._M_elems._32_5_ = 0;
          local_1b8.data._M_elems[9]._1_3_ = 0;
          local_1b8.exp = 0;
          local_1b8.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_1b8,local_48);
          if (((pcVar13->fpclass != cpp_dec_float_NaN) && (local_1b8.fpclass != cpp_dec_float_NaN))
             && (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                    (pcVar13,&local_1b8), iVar11 < 0)) {
            local_138._0_4_ = cpp_dec_float_finite;
            local_138._4_4_ = 10;
            local_168 = (undefined1  [16])0x0;
            local_158[0] = 0;
            local_158[1] = 0;
            stack0xfffffffffffffeb0 = 0;
            uStack_14b = 0;
            local_148[0] = 0;
            local_148[1] = 0;
            local_148[2] = 0;
            local_13c = false;
            if ((cpp_dec_float<50U,_int,_void> *)local_168 ==
                (cpp_dec_float<50U,_int,_void> *)(lVar15 + local_178)) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        ((cpp_dec_float<50U,_int,_void> *)local_168,pcVar13);
              if (local_168._0_4_ != 0 || (fpclass_type)local_138 != cpp_dec_float_finite) {
                local_13c = (bool)(local_13c ^ 1);
              }
            }
            else {
              if ((cpp_dec_float<50U,_int,_void> *)local_168 != pcVar13) {
                local_148._0_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 8);
                local_168 = *(undefined1 (*) [16])(pcVar13->data)._M_elems;
                local_158._0_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 4);
                uVar7 = *(undefined8 *)((pcVar13->data)._M_elems + 6);
                stack0xfffffffffffffeb0 = (undefined5)uVar7;
                uStack_14b = (undefined3)((ulong)uVar7 >> 0x28);
                local_148[2] = pcVar13->exp;
                local_13c = pcVar13->neg;
                local_138._0_4_ = pcVar13->fpclass;
                local_138._4_4_ = pcVar13->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        ((cpp_dec_float<50U,_int,_void> *)local_168,
                         (cpp_dec_float<50U,_int,_void> *)(lVar15 + local_178));
            }
            local_f8._0_4_ = cpp_dec_float_finite;
            local_f8._4_4_ = 10;
            local_128 = (undefined1  [16])0x0;
            local_118[0] = 0;
            local_118[1] = 0;
            stack0xfffffffffffffef0 = 0;
            uStack_10b = 0;
            _local_108 = 0;
            uStack_103 = 0;
            local_100 = 0;
            local_fc = false;
            pcVar13 = (cpp_dec_float<50U,_int,_void> *)local_168;
            if ((cpp_dec_float<50U,_int,_void> *)local_128 != local_a8) {
              _local_108 = (undefined5)local_148._0_8_;
              uStack_103 = SUB83(local_148._0_8_,5);
              local_118[0] = local_158[0];
              local_118[1] = local_158[1];
              stack0xfffffffffffffef0 = stack0xfffffffffffffeb0;
              uStack_10b = uStack_14b;
              local_128 = local_168;
              local_100 = local_148[2];
              local_fc = local_13c;
              local_f8._0_4_ = (fpclass_type)local_138;
              local_f8._4_4_ = local_138._4_4_;
              pcVar13 = local_a8;
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      ((cpp_dec_float<50U,_int,_void> *)local_128,pcVar13);
LAB_002a4566:
            local_1b8.fpclass = cpp_dec_float_finite;
            local_1b8.prec_elem = 10;
            local_1b8.data._M_elems[0] = 0;
            local_1b8.data._M_elems[1] = 0;
            local_1b8.data._M_elems[2] = 0;
            local_1b8.data._M_elems[3] = 0;
            local_1b8.data._M_elems[4] = 0;
            local_1b8.data._M_elems[5] = 0;
            local_1b8.data._M_elems._24_5_ = 0;
            local_1b8.data._M_elems[7]._1_3_ = 0;
            local_1b8.data._M_elems._32_5_ = 0;
            local_1b8.data._M_elems[9]._1_3_ = 0;
            local_1b8.exp = 0;
            local_1b8.neg = false;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_1b8,(cpp_dec_float<50U,_int,_void> *)local_128,
                       (cpp_dec_float<50U,_int,_void> *)local_e8);
            if (((local_1b8.fpclass != cpp_dec_float_NaN) &&
                (local_170->fpclass != cpp_dec_float_NaN)) &&
               (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_1b8,local_170), iVar11 < 0)) {
              *(ulong *)((local_170->data)._M_elems + 8) =
                   CONCAT35(local_1b8.data._M_elems[9]._1_3_,local_1b8.data._M_elems._32_5_);
              *(undefined8 *)((local_170->data)._M_elems + 4) = local_1b8.data._M_elems._16_8_;
              *(ulong *)((local_170->data)._M_elems + 6) =
                   CONCAT35(local_1b8.data._M_elems[7]._1_3_,local_1b8.data._M_elems._24_5_);
              *(undefined8 *)(local_170->data)._M_elems = local_1b8.data._M_elems._0_8_;
              *(undefined8 *)((local_170->data)._M_elems + 2) = local_1b8.data._M_elems._8_8_;
              local_170->exp = local_1b8.exp;
              local_170->neg = local_1b8.neg;
              local_170->fpclass = local_1b8.fpclass;
              local_170->prec_elem = local_1b8.prec_elem;
              local_17c = uVar14;
            }
          }
        }
        uVar14 = local_17c;
        lVar17 = lVar17 + 1;
      } while (lVar17 < *(int *)(lVar16 + 0x58));
      if ((int)local_17c < 0) {
        return local_17c;
      }
      lVar16 = (ulong)local_17c * 0x38;
      local_c8._0_8_ = *(undefined8 *)(lVar6 + 0x20 + lVar16);
      local_e8 = *(undefined1 (*) [16])(lVar6 + lVar16);
      puVar1 = (uint *)(lVar6 + 0x10 + lVar16);
      local_d8._0_8_ = *(undefined8 *)puVar1;
      uVar7 = *(undefined8 *)(puVar1 + 2);
      stack0xffffffffffffff30 = (undefined5)uVar7;
      uStack_cb = (undefined3)((ulong)uVar7 >> 0x28);
      local_c8[2] = *(int *)(lVar6 + 0x28 + lVar16);
      local_bc = *(bool *)(lVar6 + 0x2c + lVar16);
      local_b8 = *(undefined8 *)(lVar6 + 0x30 + lVar16);
      pcVar13 = local_170;
      lVar17 = local_a0;
      if ((((fpclass_type)local_b8 != cpp_dec_float_NaN) && (local_98.fpclass != cpp_dec_float_NaN))
         && (((iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  ((cpp_dec_float<50U,_int,_void> *)local_e8,&local_98),
              lVar17 = local_a0, pcVar13 = local_170, 0 < iVar11 &&
              ((*(int *)(local_178 + 0x30 + lVar16) != 2 &&
               (*(int *)(local_f0 + 0x30 + lVar16) != 2)))) &&
             (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)(local_178 + lVar16),
                                  (cpp_dec_float<50U,_int,_void> *)(local_f0 + lVar16)), -1 < iVar11
             )))) goto LAB_002a50c2;
      local_1b8.data._M_elems[0] = local_98.data._M_elems[0];
      local_1b8.data._M_elems[1] = local_98.data._M_elems[1];
      local_1b8.data._M_elems[2] = local_98.data._M_elems[2];
      local_1b8.data._M_elems[3] = local_98.data._M_elems[3];
      auVar10 = (undefined1  [16])local_1b8.data._M_elems._0_16_;
      local_1b8.data._M_elems._32_5_ = local_98.data._M_elems._32_5_;
      local_1b8.data._M_elems[9]._1_3_ = local_98.data._M_elems[9]._1_3_;
      local_1b8.data._M_elems[4] = local_98.data._M_elems[4];
      local_1b8.data._M_elems[5] = local_98.data._M_elems[5];
      local_1b8.data._M_elems._24_5_ = local_98.data._M_elems._24_5_;
      local_1b8.data._M_elems[7]._1_3_ = local_98.data._M_elems[7]._1_3_;
      local_1b8.exp = local_98.exp;
      local_1b8.neg = local_98.neg;
      local_1b8.fpclass = local_98.fpclass;
      local_1b8.prec_elem = local_98.prec_elem;
      local_1b8.data._M_elems[0] = local_98.data._M_elems[0];
      if (local_1b8.data._M_elems[0] != 0 || local_98.fpclass != 0) {
        local_1b8.neg = (bool)(local_98.neg ^ 1);
      }
      local_1b8.data._M_elems._0_16_ = auVar10;
      if (((((local_98.fpclass != 2) && ((fpclass_type)local_b8 != cpp_dec_float_NaN)) &&
           (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)local_e8,&local_1b8), iVar11 < 0))
          && ((*(int *)(local_178 + 0x30 + lVar16) != 2 && (*(int *)(lVar17 + 0x30 + lVar16) != 2)))
          ) && (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   ((cpp_dec_float<50U,_int,_void> *)(local_178 + lVar16),
                                    (cpp_dec_float<50U,_int,_void> *)(lVar17 + lVar16)), iVar11 < 1)
         ) goto LAB_002a50c2;
      if ((((fpclass_type)local_b8 != cpp_dec_float_NaN) && (local_98.fpclass != cpp_dec_float_NaN))
         && (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                ((cpp_dec_float<50U,_int,_void> *)local_e8,&local_98), 0 < iVar11))
      {
        lVar17 = local_f0;
      }
      goto LAB_002a4f27;
    }
  }
  if (*(int *)(lVar16 + 0x58) < 1) {
    return -1;
  }
  local_58 = *(double *)(in_FS_OFFSET + -8);
  local_a8 = &(((SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)&local_a8->data)->delta).m_backend;
  uStack_50 = 0;
  local_48 = -local_58;
  uStack_40 = 0x8000000000000000;
  local_17c = 0xffffffff;
  lVar15 = 0;
  do {
    uVar14 = *(uint *)(*(long *)(lVar16 + 0x60) + lVar15 * 4);
    lVar17 = (long)(int)uVar14 * 0x38;
    local_c8._0_8_ = *(undefined8 *)(lVar6 + 0x20 + lVar17);
    local_e8 = *(undefined1 (*) [16])(lVar6 + lVar17);
    puVar1 = (uint *)(lVar6 + 0x10 + lVar17);
    local_d8._0_8_ = *(undefined8 *)puVar1;
    uVar7 = *(undefined8 *)(puVar1 + 2);
    stack0xffffffffffffff30 = (undefined5)uVar7;
    uStack_cb = (undefined3)((ulong)uVar7 >> 0x28);
    local_c8[2] = *(int *)(lVar6 + 0x28 + lVar17);
    local_bc = *(bool *)(lVar6 + 0x2c + lVar17);
    local_b8 = *(undefined8 *)(lVar6 + 0x30 + lVar17);
    local_1b8.data._M_elems._32_5_ = local_98.data._M_elems._32_5_;
    local_1b8.data._M_elems[9]._1_3_ = local_98.data._M_elems[9]._1_3_;
    local_1b8.data._M_elems[4] = local_98.data._M_elems[4];
    local_1b8.data._M_elems[5] = local_98.data._M_elems[5];
    local_1b8.data._M_elems._24_5_ = local_98.data._M_elems._24_5_;
    local_1b8.data._M_elems[7]._1_3_ = local_98.data._M_elems[7]._1_3_;
    local_1b8.data._M_elems[0] = local_98.data._M_elems[0];
    local_1b8.data._M_elems[1] = local_98.data._M_elems[1];
    local_1b8.data._M_elems[2] = local_98.data._M_elems[2];
    local_1b8.data._M_elems[3] = local_98.data._M_elems[3];
    auVar10 = (undefined1  [16])local_1b8.data._M_elems._0_16_;
    local_1b8.exp = local_98.exp;
    local_1b8.neg = local_98.neg;
    local_1b8.fpclass = local_98.fpclass;
    local_1b8.prec_elem = local_98.prec_elem;
    local_1b8.data._M_elems[0] = local_98.data._M_elems[0];
    if (local_1b8.data._M_elems[0] != 0 || local_98.fpclass != 0) {
      local_1b8.neg = (bool)(local_98.neg ^ 1);
    }
    uVar12 = local_98._48_8_;
    local_1b8.data._M_elems._0_16_ = auVar10;
    if ((fpclass_type)local_b8 == cpp_dec_float_NaN || local_98.fpclass == 2) {
LAB_002a474f:
      if ((((fpclass_type)local_b8 != cpp_dec_float_NaN) && ((int)uVar12 != 2)) &&
         (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             ((cpp_dec_float<50U,_int,_void> *)local_e8,&local_98), 0 < iVar11)) {
        ::soplex::infinity::__tls_init();
        pcVar13 = (cpp_dec_float<50U,_int,_void> *)(local_a0 + lVar17);
        local_1b8.fpclass = cpp_dec_float_finite;
        local_1b8.prec_elem = 10;
        local_1b8.data._M_elems[0] = 0;
        local_1b8.data._M_elems[1] = 0;
        local_1b8.data._M_elems[2] = 0;
        local_1b8.data._M_elems[3] = 0;
        local_1b8.data._M_elems[4] = 0;
        local_1b8.data._M_elems[5] = 0;
        local_1b8.data._M_elems._24_5_ = 0;
        local_1b8.data._M_elems[7]._1_3_ = 0;
        local_1b8.data._M_elems._32_5_ = 0;
        local_1b8.data._M_elems[9]._1_3_ = 0;
        local_1b8.exp = 0;
        local_1b8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_1b8,local_48);
        if (((pcVar13->fpclass != cpp_dec_float_NaN) && (local_1b8.fpclass != cpp_dec_float_NaN)) &&
           (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (pcVar13,&local_1b8), 0 < iVar11)) {
          local_138._0_4_ = cpp_dec_float_finite;
          local_138._4_4_ = 10;
          local_168 = (undefined1  [16])0x0;
          local_158[0] = 0;
          local_158[1] = 0;
          stack0xfffffffffffffeb0 = 0;
          uStack_14b = 0;
          local_148[0] = 0;
          local_148[1] = 0;
          local_148[2] = 0;
          local_13c = false;
          if ((cpp_dec_float<50U,_int,_void> *)local_168 ==
              (cpp_dec_float<50U,_int,_void> *)(lVar17 + local_178)) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      ((cpp_dec_float<50U,_int,_void> *)local_168,pcVar13);
            if (local_168._0_4_ != 0 || (fpclass_type)local_138 != cpp_dec_float_finite) {
              local_13c = (bool)(local_13c ^ 1);
            }
          }
          else {
            if ((cpp_dec_float<50U,_int,_void> *)local_168 != pcVar13) {
              local_148._0_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 8);
              local_168 = *(undefined1 (*) [16])(pcVar13->data)._M_elems;
              local_158._0_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 4);
              uVar7 = *(undefined8 *)((pcVar13->data)._M_elems + 6);
              stack0xfffffffffffffeb0 = (undefined5)uVar7;
              uStack_14b = (undefined3)((ulong)uVar7 >> 0x28);
              local_148[2] = pcVar13->exp;
              local_13c = pcVar13->neg;
              local_138._0_4_ = pcVar13->fpclass;
              local_138._4_4_ = pcVar13->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      ((cpp_dec_float<50U,_int,_void> *)local_168,
                       (cpp_dec_float<50U,_int,_void> *)(lVar17 + local_178));
          }
          local_f8._0_4_ = cpp_dec_float_finite;
          local_f8._4_4_ = 10;
          local_128 = (undefined1  [16])0x0;
          local_118[0] = 0;
          local_118[1] = 0;
          stack0xfffffffffffffef0 = 0;
          uStack_10b = 0;
          _local_108 = 0;
          uStack_103 = 0;
          local_100 = 0;
          local_fc = false;
          if ((cpp_dec_float<50U,_int,_void> *)local_128 == local_a8) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      ((cpp_dec_float<50U,_int,_void> *)local_128,
                       (cpp_dec_float<50U,_int,_void> *)local_168);
            if (local_128._0_4_ != 0 || (fpclass_type)local_f8 != cpp_dec_float_finite) {
              local_fc = (bool)(local_fc ^ 1);
            }
          }
          else {
            _local_108 = (undefined5)local_148._0_8_;
            uStack_103 = SUB83(local_148._0_8_,5);
            local_118[0] = local_158[0];
            local_118[1] = local_158[1];
            stack0xfffffffffffffef0 = stack0xfffffffffffffeb0;
            uStack_10b = uStack_14b;
            local_128 = local_168;
            local_100 = local_148[2];
            local_fc = local_13c;
            local_f8._0_4_ = (fpclass_type)local_138;
            local_f8._4_4_ = local_138._4_4_;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      ((cpp_dec_float<50U,_int,_void> *)local_128,local_a8);
          }
          goto LAB_002a4b4f;
        }
      }
    }
    else {
      iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         ((cpp_dec_float<50U,_int,_void> *)local_e8,&local_1b8);
      if (-1 < iVar11) {
        uVar12 = local_98._48_8_ & 0xffffffff;
        goto LAB_002a474f;
      }
      ::soplex::infinity::__tls_init();
      pcVar13 = (cpp_dec_float<50U,_int,_void> *)(local_f0 + lVar17);
      local_1b8.fpclass = cpp_dec_float_finite;
      local_1b8.prec_elem = 10;
      local_1b8.data._M_elems[0] = 0;
      local_1b8.data._M_elems[1] = 0;
      local_1b8.data._M_elems[2] = 0;
      local_1b8.data._M_elems[3] = 0;
      local_1b8.data._M_elems[4] = 0;
      local_1b8.data._M_elems[5] = 0;
      local_1b8.data._M_elems._24_5_ = 0;
      local_1b8.data._M_elems[7]._1_3_ = 0;
      local_1b8.data._M_elems._32_5_ = 0;
      local_1b8.data._M_elems[9]._1_3_ = 0;
      local_1b8.exp = 0;
      local_1b8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_1b8,local_58);
      if (((pcVar13->fpclass != cpp_dec_float_NaN) && (local_1b8.fpclass != cpp_dec_float_NaN)) &&
         (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (pcVar13,&local_1b8), iVar11 < 0)) {
        local_138._0_4_ = cpp_dec_float_finite;
        local_138._4_4_ = 10;
        local_168 = (undefined1  [16])0x0;
        local_158[0] = 0;
        local_158[1] = 0;
        stack0xfffffffffffffeb0 = 0;
        uStack_14b = 0;
        local_148[0] = 0;
        local_148[1] = 0;
        local_148[2] = 0;
        local_13c = false;
        if ((cpp_dec_float<50U,_int,_void> *)local_168 ==
            (cpp_dec_float<50U,_int,_void> *)(lVar17 + local_178)) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    ((cpp_dec_float<50U,_int,_void> *)local_168,pcVar13);
          if (local_168._0_4_ != 0 || (fpclass_type)local_138 != cpp_dec_float_finite) {
            local_13c = (bool)(local_13c ^ 1);
          }
        }
        else {
          if ((cpp_dec_float<50U,_int,_void> *)local_168 != pcVar13) {
            local_148._0_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 8);
            local_168 = *(undefined1 (*) [16])(pcVar13->data)._M_elems;
            local_158._0_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 4);
            uVar7 = *(undefined8 *)((pcVar13->data)._M_elems + 6);
            stack0xfffffffffffffeb0 = (undefined5)uVar7;
            uStack_14b = (undefined3)((ulong)uVar7 >> 0x28);
            local_148[2] = pcVar13->exp;
            local_13c = pcVar13->neg;
            local_138._0_4_ = pcVar13->fpclass;
            local_138._4_4_ = pcVar13->prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    ((cpp_dec_float<50U,_int,_void> *)local_168,
                     (cpp_dec_float<50U,_int,_void> *)(lVar17 + local_178));
        }
        local_f8._0_4_ = cpp_dec_float_finite;
        local_f8._4_4_ = 10;
        local_128 = (undefined1  [16])0x0;
        local_118[0] = 0;
        local_118[1] = 0;
        stack0xfffffffffffffef0 = 0;
        uStack_10b = 0;
        _local_108 = 0;
        uStack_103 = 0;
        local_100 = 0;
        local_fc = false;
        pcVar13 = (cpp_dec_float<50U,_int,_void> *)local_168;
        if ((cpp_dec_float<50U,_int,_void> *)local_128 != local_a8) {
          _local_108 = (undefined5)local_148._0_8_;
          uStack_103 = SUB83(local_148._0_8_,5);
          local_118[0] = local_158[0];
          local_118[1] = local_158[1];
          stack0xfffffffffffffef0 = stack0xfffffffffffffeb0;
          uStack_10b = uStack_14b;
          local_128 = local_168;
          local_100 = local_148[2];
          local_fc = local_13c;
          local_f8._0_4_ = (fpclass_type)local_138;
          local_f8._4_4_ = local_138._4_4_;
          pcVar13 = local_a8;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                  ((cpp_dec_float<50U,_int,_void> *)local_128,pcVar13);
LAB_002a4b4f:
        local_1b8.fpclass = cpp_dec_float_finite;
        local_1b8.prec_elem = 10;
        local_1b8.data._M_elems[0] = 0;
        local_1b8.data._M_elems[1] = 0;
        local_1b8.data._M_elems[2] = 0;
        local_1b8.data._M_elems[3] = 0;
        local_1b8.data._M_elems[4] = 0;
        local_1b8.data._M_elems[5] = 0;
        local_1b8.data._M_elems._24_5_ = 0;
        local_1b8.data._M_elems[7]._1_3_ = 0;
        local_1b8.data._M_elems._32_5_ = 0;
        local_1b8.data._M_elems[9]._1_3_ = 0;
        local_1b8.exp = 0;
        local_1b8.neg = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_1b8,(cpp_dec_float<50U,_int,_void> *)local_128,
                   (cpp_dec_float<50U,_int,_void> *)local_e8);
        if (((local_1b8.fpclass != cpp_dec_float_NaN) && (local_170->fpclass != cpp_dec_float_NaN))
           && (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_1b8,local_170), 0 < iVar11)) {
          *(ulong *)((local_170->data)._M_elems + 8) =
               CONCAT35(local_1b8.data._M_elems[9]._1_3_,local_1b8.data._M_elems._32_5_);
          *(undefined8 *)((local_170->data)._M_elems + 4) = local_1b8.data._M_elems._16_8_;
          *(ulong *)((local_170->data)._M_elems + 6) =
               CONCAT35(local_1b8.data._M_elems[7]._1_3_,local_1b8.data._M_elems._24_5_);
          *(undefined8 *)(local_170->data)._M_elems = local_1b8.data._M_elems._0_8_;
          *(undefined8 *)((local_170->data)._M_elems + 2) = local_1b8.data._M_elems._8_8_;
          local_170->exp = local_1b8.exp;
          local_170->neg = local_1b8.neg;
          local_170->fpclass = local_1b8.fpclass;
          local_170->prec_elem = local_1b8.prec_elem;
          local_17c = uVar14;
        }
      }
    }
    lVar17 = local_a0;
    pcVar13 = local_170;
    uVar14 = local_17c;
    lVar15 = lVar15 + 1;
  } while (lVar15 < *(int *)(lVar16 + 0x58));
  if ((int)local_17c < 0) {
    return local_17c;
  }
  lVar16 = (ulong)local_17c * 0x38;
  local_c8._0_8_ = *(undefined8 *)(lVar6 + 0x20 + lVar16);
  local_e8 = *(undefined1 (*) [16])(lVar6 + lVar16);
  puVar1 = (uint *)(lVar6 + 0x10 + lVar16);
  local_d8._0_8_ = *(undefined8 *)puVar1;
  uVar7 = *(undefined8 *)(puVar1 + 2);
  stack0xffffffffffffff30 = (undefined5)uVar7;
  uStack_cb = (undefined3)((ulong)uVar7 >> 0x28);
  local_c8[2] = *(int *)(lVar6 + 0x28 + lVar16);
  local_bc = *(bool *)(lVar6 + 0x2c + lVar16);
  local_b8 = *(undefined8 *)(lVar6 + 0x30 + lVar16);
  local_1b8.data._M_elems._32_5_ = local_98.data._M_elems._32_5_;
  local_1b8.data._M_elems[9]._1_3_ = local_98.data._M_elems[9]._1_3_;
  local_1b8.data._M_elems[4] = local_98.data._M_elems[4];
  local_1b8.data._M_elems[5] = local_98.data._M_elems[5];
  local_1b8.data._M_elems._24_5_ = local_98.data._M_elems._24_5_;
  local_1b8.data._M_elems[7]._1_3_ = local_98.data._M_elems[7]._1_3_;
  local_1b8.data._M_elems[0] = local_98.data._M_elems[0];
  local_1b8.data._M_elems[1] = local_98.data._M_elems[1];
  local_1b8.data._M_elems[2] = local_98.data._M_elems[2];
  local_1b8.data._M_elems[3] = local_98.data._M_elems[3];
  auVar10 = (undefined1  [16])local_1b8.data._M_elems._0_16_;
  local_1b8.exp = local_98.exp;
  local_1b8.neg = local_98.neg;
  local_1b8.fpclass = local_98.fpclass;
  local_1b8.prec_elem = local_98.prec_elem;
  local_1b8.data._M_elems[0] = local_98.data._M_elems[0];
  if (local_1b8.data._M_elems[0] != 0 || local_98.fpclass != 0) {
    local_1b8.neg = (bool)(local_98.neg ^ 1);
  }
  local_1b8.data._M_elems._0_16_ = auVar10;
  if ((((local_98.fpclass != 2 && (fpclass_type)local_b8 != cpp_dec_float_NaN) &&
       (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           ((cpp_dec_float<50U,_int,_void> *)local_e8,&local_1b8), iVar11 < 0)) &&
      ((*(int *)(local_178 + 0x30 + lVar16) != 2 &&
       ((*(int *)(local_f0 + 0x30 + lVar16) != 2 &&
        (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            ((cpp_dec_float<50U,_int,_void> *)(local_178 + lVar16),
                             (cpp_dec_float<50U,_int,_void> *)(local_f0 + lVar16)), -1 < iVar11)))))
      ) || (((fpclass_type)local_b8 != cpp_dec_float_NaN &&
            ((((local_98.fpclass != cpp_dec_float_NaN &&
               (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   ((cpp_dec_float<50U,_int,_void> *)local_e8,&local_98), 0 < iVar11
               )) && (*(int *)(local_178 + 0x30 + lVar16) != 2)) &&
             ((*(int *)(lVar17 + 0x30 + lVar16) != 2 &&
              (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  ((cpp_dec_float<50U,_int,_void> *)(local_178 + lVar16),
                                   (cpp_dec_float<50U,_int,_void> *)(lVar17 + lVar16)), iVar11 < 1))
             )))))) {
LAB_002a50c2:
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)pcVar13,0.0);
    return uVar14;
  }
  if ((((fpclass_type)local_b8 != cpp_dec_float_NaN) && (local_98.fpclass != cpp_dec_float_NaN)) &&
     (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         ((cpp_dec_float<50U,_int,_void> *)local_e8,&local_98), iVar11 < 0)) {
    lVar17 = local_f0;
  }
LAB_002a4f27:
  *(undefined8 *)((pcVar13->data)._M_elems + 8) = *(undefined8 *)(lVar17 + 0x20 + lVar16);
  uVar7 = *(undefined8 *)(lVar17 + lVar16);
  uVar8 = ((undefined8 *)(lVar17 + lVar16))[1];
  puVar2 = (undefined8 *)(lVar17 + 0x10 + lVar16);
  uVar9 = puVar2[1];
  *(undefined8 *)((pcVar13->data)._M_elems + 4) = *puVar2;
  *(undefined8 *)((pcVar13->data)._M_elems + 6) = uVar9;
  *(undefined8 *)(pcVar13->data)._M_elems = uVar7;
  *(undefined8 *)((pcVar13->data)._M_elems + 2) = uVar8;
  iVar11 = *(int *)(lVar17 + 0x28 + lVar16);
  pcVar13->exp = iVar11;
  bVar3 = *(bool *)(lVar17 + 0x2c + lVar16);
  pcVar13->neg = bVar3;
  fVar4 = *(fpclass_type *)(lVar17 + 0x30 + lVar16);
  pcVar13->fpclass = fVar4;
  iVar5 = *(int32_t *)(lVar17 + 0x34 + lVar16);
  pcVar13->prec_elem = iVar5;
  local_f8._0_4_ = cpp_dec_float_finite;
  local_f8._4_4_ = 10;
  local_128 = ZEXT816(0);
  local_118[0] = 0;
  local_118[1] = 0;
  stack0xfffffffffffffef0 = 0;
  uStack_10b = 0;
  _local_108 = 0;
  uStack_103 = 0;
  local_100 = 0;
  local_fc = false;
  if ((cpp_dec_float<50U,_int,_void> *)local_128 ==
      (cpp_dec_float<50U,_int,_void> *)(local_178 + lVar16)) {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
              ((cpp_dec_float<50U,_int,_void> *)local_128,pcVar13);
    if (local_128._0_4_ != 0 || (fpclass_type)local_f8 != cpp_dec_float_finite) {
      local_fc = (bool)(local_fc ^ 1);
    }
  }
  else {
    if ((cpp_dec_float<50U,_int,_void> *)local_128 != pcVar13) {
      uVar7 = *(undefined8 *)((pcVar13->data)._M_elems + 8);
      _local_108 = (undefined5)uVar7;
      uStack_103 = (undefined3)((ulong)uVar7 >> 0x28);
      local_128 = *(undefined1 (*) [16])(pcVar13->data)._M_elems;
      local_118._0_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 4);
      uVar7 = *(undefined8 *)((pcVar13->data)._M_elems + 6);
      stack0xfffffffffffffef0 = (undefined5)uVar7;
      uStack_10b = (undefined3)((ulong)uVar7 >> 0x28);
      local_f8._4_4_ = iVar5;
      local_f8._0_4_ = fVar4;
      local_100 = iVar11;
      local_fc = bVar3;
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
              ((cpp_dec_float<50U,_int,_void> *)local_128,
               (cpp_dec_float<50U,_int,_void> *)(local_178 + lVar16));
  }
  local_1b8.fpclass = cpp_dec_float_finite;
  local_1b8.prec_elem = 10;
  local_1b8.data._M_elems._0_16_ = ZEXT816(0);
  local_1b8.data._M_elems[4] = 0;
  local_1b8.data._M_elems[5] = 0;
  local_1b8.data._M_elems._24_5_ = 0;
  local_1b8.data._M_elems[7]._1_3_ = 0;
  local_1b8.data._M_elems._32_5_ = 0;
  local_1b8.data._M_elems[9]._1_3_ = 0;
  local_1b8.exp = 0;
  local_1b8.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_1b8,(cpp_dec_float<50U,_int,_void> *)local_128,
             (cpp_dec_float<50U,_int,_void> *)local_e8);
  *(ulong *)((pcVar13->data)._M_elems + 8) =
       CONCAT35(local_1b8.data._M_elems[9]._1_3_,local_1b8.data._M_elems._32_5_);
  *(undefined8 *)((pcVar13->data)._M_elems + 4) = local_1b8.data._M_elems._16_8_;
  *(ulong *)((pcVar13->data)._M_elems + 6) =
       CONCAT35(local_1b8.data._M_elems[7]._1_3_,local_1b8.data._M_elems._24_5_);
  *(undefined8 *)(pcVar13->data)._M_elems = local_1b8.data._M_elems._0_8_;
  *(undefined8 *)((pcVar13->data)._M_elems + 2) = local_1b8.data._M_elems._8_8_;
  pcVar13->exp = local_1b8.exp;
  pcVar13->neg = local_1b8.neg;
  pcVar13->fpclass = local_1b8.fpclass;
  pcVar13->prec_elem = local_1b8.prec_elem;
  return uVar14;
}

Assistant:

int SPxDefaultRT<R>::selectLeave(R& val, R, bool)
{
   this->solver()->fVec().delta().setup();

   const R*   vec = this->solver()->fVec().get_const_ptr();
   const R*   upd = this->solver()->fVec().delta().values();
   const IdxSet& idx = this->solver()->fVec().idx();
   const R*   ub  = this->solver()->ubBound().get_const_ptr();
   const R*   lb  = this->solver()->lbBound().get_const_ptr();

   R epsilon = this->solver()->epsilon();
   int  leave   = -1;

   R x;
   int  i;
   int  j;

   // PARALLEL the j loop could be parallelized
   if(val > 0)
   {
      // Loop over NZEs of delta vector.
      for(j = 0; j < idx.size(); ++j)
      {
         i = idx.index(j);
         x = upd[i];

         if(x > epsilon)
         {
            if(ub[i] < R(infinity))
            {
               R y = (ub[i] - vec[i] + this->delta) / x;

               if(y < val)
               {
                  leave = i;
                  val   = y;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(lb[i] > R(-infinity))
            {
               R y = (lb[i] - vec[i] - this->delta) / x;

               if(y < val)
               {
                  leave = i;
                  val   = y;
               }
            }
         }
      }

      if(leave >= 0)
      {
         x   = upd[leave];

         // BH 2005-11-30: It may well happen that the basis is degenerate and the
         // selected leaving variable is (at most this->delta) beyond its bound. (This
         // happens for instance on LP/netlib/adlittle.mps with setting -r -t0.)
         // In that case we do a pivot step with length zero to avoid difficulties.
         if((x > epsilon  && vec[leave] >= ub[leave]) ||
               (x < -epsilon && vec[leave] <= lb[leave]))
         {
            val = 0.0;
         }
         else
         {
            val = (x > epsilon) ? ub[leave] : lb[leave];
            val = (val - vec[leave]) / x;
         }
      }

      SOPLEX_ASSERT_WARN("WDEFRT01", val > -epsilon);
   }
   else
   {
      for(j = 0; j < idx.size(); ++j)
      {
         i = idx.index(j);
         x = upd[i];

         if(x < -epsilon)
         {
            if(ub[i] < R(infinity))
            {
               R y = (ub[i] - vec[i] + this->delta) / x;

               if(y > val)
               {
                  leave = i;
                  val   = y;
               }
            }
         }
         else if(x > epsilon)
         {
            if(lb[i] > R(-infinity))
            {
               R y = (lb[i] - vec[i] - this->delta) / x;

               if(y > val)
               {
                  leave = i;
                  val   = y;
               }
            }
         }
      }

      if(leave >= 0)
      {
         x   = upd[leave];

         // See comment above.
         if((x < -epsilon && vec[leave] >= ub[leave]) ||
               (x > epsilon  && vec[leave] <= lb[leave]))
         {
            val = 0.0;
         }
         else
         {
            val = (x < epsilon) ? ub[leave] : lb[leave];
            val = (val - vec[leave]) / x;
         }
      }

      SOPLEX_ASSERT_WARN("WDEFRT02", val < epsilon);
   }

   return leave;
}